

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

void newuhs(boolean incr)

{
  int iVar1;
  boolean bVar2;
  schar sVar3;
  int iVar4;
  char *pcVar5;
  int local_44;
  char *local_40;
  char *local_38;
  char *local_30;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_10;
  int h;
  uint newhs;
  boolean incr_local;
  
  if (u.uhunger < 0x3e9) {
    if (u.uhunger < 0x97) {
      if (u.uhunger < 0x33) {
        local_20 = 4;
        if (0 < u.uhunger) {
          local_20 = 3;
        }
      }
      else {
        local_20 = 2;
      }
      local_1c = local_20;
    }
    else {
      local_1c = 1;
    }
    local_18 = local_1c;
  }
  else {
    local_18 = 0;
  }
  local_10 = local_18;
  if ((occupation == eatfood) || (force_save_hs != '\0')) {
    if (newuhs_saved_hs == '\0') {
      newuhs_save_hs = u.uhs;
      newuhs_saved_hs = '\x01';
    }
    u.uhs = local_18;
  }
  else {
    if (newuhs_saved_hs != '\0') {
      u.uhs = newuhs_save_hs;
      newuhs_saved_hs = '\0';
    }
    if (local_18 == 4) {
      bVar2 = is_fainted();
      if (bVar2 != '\0') {
        local_10 = 5;
      }
      if ((u.uhs < 4) || (iVar4 = rn2(0x14 - u.uhunger / 10), iVar1 = u.uhunger, 0x12 < iVar4)) {
        bVar2 = is_fainted();
        if ((bVar2 == '\0') && (-1 < multi)) {
          stop_occupation();
          pline("You faint from lack of food.");
          flags.soundok = '\0';
          nomul(u.uhunger / 10 + -10,"fainted from lack of food");
          nomovemsg = "You regain consciousness.";
          afternmv = unfaint;
          local_10 = 5;
        }
      }
      else {
        sVar3 = acurr(4);
        if (iVar1 < -(sVar3 * 0x14 + 200)) {
          u.uhs = 6;
          iflags.botl = '\x01';
          bot();
          pline("You die from starvation.");
          killer_format = 1;
          killer = "starvation";
          done(3);
          return;
        }
      }
    }
    if (local_10 != u.uhs) {
      if ((local_10 < 3) || (2 < u.uhs)) {
        if ((local_10 < 3) && (2 < u.uhs)) {
          losestr(-1,'\x01');
        }
      }
      else {
        losestr(1,'\x01');
      }
      if (local_10 == 2) {
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
          if (incr == '\0') {
            local_30 = "You only feel hungry now.";
          }
          else {
            local_30 = "You are beginning to feel hungry.";
            if (u.uhunger < 0x91) {
              local_30 = "You feel hungry.";
            }
          }
          pline(local_30);
        }
        else {
          pcVar5 = "You are getting the munchies.";
          if (incr == '\0') {
            pcVar5 = "You now have a lesser case of the munchies.";
          }
          pline(pcVar5);
        }
        if ((((incr != '\0') && (occupation != (_func_int *)0x0)) && (occupation != eatfood)) &&
           (occupation != opentin)) {
          stop_occupation();
        }
        if ((incr != '\0') && (flags.run != 0)) {
          nomul(0,(char *)0x0);
        }
      }
      else if (local_10 == 3) {
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
          if ((incr == '\0') ||
             (((urole.malenum != 0x168 && (urace.malenum != 0x111)) && (urole.malenum != 0x167)))) {
            if (incr == '\0') {
              local_40 = "You feel weak now.";
            }
            else {
              local_40 = "You are beginning to feel weak.";
              if (u.uhunger < 0x2d) {
                local_40 = "You feel weak.";
              }
            }
            pline(local_40);
          }
          else {
            if ((urole.malenum == 0x168) || (urole.malenum == 0x167)) {
              local_38 = urole.name.m;
            }
            else {
              local_38 = "Elf";
            }
            pline("%s needs food, badly!",local_38);
          }
        }
        else {
          pcVar5 = "The munchies are interfering with your motor capabilities.";
          if (incr == '\0') {
            pcVar5 = "You still have the munchies.";
          }
          pline(pcVar5);
        }
        if (((incr != '\0') && (occupation != (_func_int *)0x0)) &&
           ((occupation != eatfood && (occupation != opentin)))) {
          stop_occupation();
        }
        if ((incr != '\0') && (flags.run != 0)) {
          nomul(0,(char *)0x0);
        }
      }
      u.uhs = local_10;
      iflags.botl = '\x01';
      bot();
      if (u.umonnum == u.umonster) {
        local_44 = u.uhp;
      }
      else {
        local_44 = u.mh;
      }
      if (local_44 < 1) {
        pline("You die from hunger and exhaustion.");
        killer_format = 1;
        killer = "exhaustion";
        done(3);
      }
    }
  }
  return;
}

Assistant:

void newuhs(boolean incr)
{
	unsigned newhs;
	int h = u.uhunger;

	newhs = (h > 1000) ? SATIATED :
		(h > 150) ? NOT_HUNGRY :
		(h > 50) ? HUNGRY :
		(h > 0) ? WEAK : FAINTING;

	/* While you're eating, you may pass from WEAK to HUNGRY to NOT_HUNGRY.
	 * This should not produce the message "you only feel hungry now";
	 * that message should only appear if HUNGRY is an endpoint.  Therefore
	 * we check to see if we're in the middle of eating.  If so, we save
	 * the first hunger status, and at the end of eating we decide what
	 * message to print based on the _entire_ meal, not on each little bit.
	 */
	/* It is normally possible to check if you are in the middle of a meal
	 * by checking occupation == eatfood, but there is one special case:
	 * start_eating() can call bite() for your first bite before it
	 * sets the occupation.
	 * Anyone who wants to get that case to work _without_ an ugly static
	 * force_save_hs variable, feel free.
	 */
	/* Note: If you become a certain hunger status in the middle of the
	 * meal, and still have that same status at the end of the meal,
	 * this will incorrectly print the associated message at the end of
	 * the meal instead of the middle.  Such a case is currently
	 * impossible, but could become possible if a message for SATIATED
	 * were added or if HUNGRY and WEAK were separated by a big enough
	 * gap to fit two bites.
	 */
	if (occupation == eatfood || force_save_hs) {
		if (!newuhs_saved_hs) {
			newuhs_save_hs = u.uhs;
			newuhs_saved_hs = TRUE;
		}
		u.uhs = newhs;
		return;
	} else {
		if (newuhs_saved_hs) {
			u.uhs = newuhs_save_hs;
			newuhs_saved_hs = FALSE;
		}
	}

	if (newhs == FAINTING) {
		if (is_fainted()) newhs = FAINTED;
		if (u.uhs <= WEAK || rn2(20-u.uhunger/10) >= 19) {
			if (!is_fainted() && multi >= 0 /* %% */) {
				/* stop what you're doing, then faint */
				stop_occupation();
				pline("You faint from lack of food.");
				flags.soundok = 0;
				nomul(-10+(u.uhunger/10), "fainted from lack of food");
				nomovemsg = "You regain consciousness.";
				afternmv = unfaint;
				newhs = FAINTED;
			}
		} else
		if (u.uhunger < -(int)(200 + 20*ACURR(A_CON))) {
			u.uhs = STARVED;
			iflags.botl = 1;
			bot();
			pline("You die from starvation.");
			killer_format = KILLED_BY;
			killer = "starvation";
			done(STARVING);
			/* if we return, we lifesaved, and that calls newuhs */
			return;
		}
	}

	if (newhs != u.uhs) {
		if (newhs >= WEAK && u.uhs < WEAK)
			losestr(1, TRUE);	/* this may kill you -- see below */
		else if (newhs < WEAK && u.uhs >= WEAK)
			losestr(-1, TRUE);
		switch(newhs){
		case HUNGRY:
			if (Hallucination) {
			    pline((!incr) ?
				"You now have a lesser case of the munchies." :
				"You are getting the munchies.");
			} else
			    pline((!incr) ? "You only feel hungry now." :
				  (u.uhunger < 145) ? "You feel hungry." :
				   "You are beginning to feel hungry.");
			if (incr && occupation &&
			    (occupation != eatfood && occupation != opentin))
			    stop_occupation();
			if (incr && flags.run)
			    nomul(0, NULL);
			break;
		case WEAK:
			if (Hallucination)
			    pline((!incr) ?
				  "You still have the munchies." :
      "The munchies are interfering with your motor capabilities.");
			else if (incr &&
				(Role_if (PM_WIZARD) || Race_if(PM_ELF) ||
				 Role_if (PM_VALKYRIE)))
			    pline("%s needs food, badly!",
				  (Role_if (PM_WIZARD) || Role_if(PM_VALKYRIE)) ?
				  urole.name.m : "Elf");
			else
			    pline((!incr) ? "You feel weak now." :
				  (u.uhunger < 45) ? "You feel weak." :
				   "You are beginning to feel weak.");
			if (incr && occupation &&
			    (occupation != eatfood && occupation != opentin))
			    stop_occupation();
			if (incr && flags.run)
			    nomul(0, NULL);
			break;
		}
		u.uhs = newhs;
		iflags.botl = 1;
		bot();
		if ((Upolyd ? u.mh : u.uhp) < 1) {
			pline("You die from hunger and exhaustion.");
			killer_format = KILLED_BY;
			killer = "exhaustion";
			done(STARVING);
			return;
		}
	}
}